

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O2

int __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_>::copy
          (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *this_00;
  
  this_00 = (TypedAttribute<Imath_2_5::Box<Imath_2_5::Vec2<int>_>_> *)operator_new(0x18);
  (this_00->super_Attribute)._vptr_Attribute = (_func_int **)0x0;
  (this_00->_value).min.x = 0;
  (this_00->_value).min.y = 0;
  (this_00->_value).max.x = 0;
  (this_00->_value).max.y = 0;
  TypedAttribute(this_00);
  (*(this_00->super_Attribute)._vptr_Attribute[6])(this_00,this);
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}